

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

void CVmBifNet::send_net_request(uint argc)

{
  ushort *src;
  ushort uVar1;
  vm_val_t *pvVar2;
  vm_val_t *pvVar3;
  int iVar4;
  int32_t options;
  char *pcVar5;
  size_t sVar6;
  HttpReqThread *this;
  char *pcVar7;
  vm_val_t *this_00;
  ulong srclen;
  int client_level;
  char *local_98;
  ushort *local_90;
  int server_level;
  char *lurl;
  vm_rcdesc rc;
  
  CVmBif::check_argc_range(argc,2,0x7fff);
  vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"sendNetRequest");
  (*G_host_ifc_X->_vptr_CVmHostIfc[5])(G_host_ifc_X,&client_level,&server_level);
  pvVar2 = sp_;
  if (1 < client_level) {
LAB_00203286:
    err_throw(400);
  }
  local_90 = (ushort *)CVmBif::get_str_val(sp_ + -2);
  uVar1 = *local_90;
  srclen = (ulong)uVar1;
  src = local_90 + 1;
  if (G_net_config_X == (TadsNetConfig *)0x0) {
    pcVar5 = "<image URL unknown>";
  }
  else {
    pcVar5 = TadsNetConfig::get(G_net_config_X,"image.url","<image URL unknown>");
  }
  sVar6 = CCharmapToLocal::map_utf8_alo(G_cmap_to_file_X,&lurl,(char *)src,srclen);
  vm_log_fmt("client request to %.*s by %s",sVar6 & 0xffffffff,lurl,pcVar5);
  free(lurl);
  if ((uVar1 < 7) ||
     ((iVar4 = bcmp(src,"http://",7), iVar4 != 0 && (*(long *)src != 0x2f2f3a7370747468)))) {
    err_throw(0x902);
  }
  if (((client_level == 1) && (iVar4 = match_url_domain((char *)src,srclen,"localhost"), iVar4 == 0)
      ) && (iVar4 = match_url_domain((char *)src,srclen,"127.0.0.1"), iVar4 == 0))
  goto LAB_00203286;
  local_98 = CVmBif::get_str_val(sp_ + -3);
  if (argc < 4) {
    options = 0;
  }
  else {
    options = 0;
    if (sp_[-4].typ != VM_NIL) {
      options = vm_val_t::num_to_int(sp_ + -4);
    }
    if (argc != 4) {
      if (sp_[-5].typ == VM_NIL) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = CVmBif::get_str_val(sp_ + -5);
      }
      pvVar3 = sp_;
      if (argc < 6) {
        this_00 = (vm_val_t *)0x0;
      }
      else {
        if (sp_[-6].typ == VM_NIL) {
          this_00 = (vm_val_t *)0x0;
        }
        else {
          this_00 = sp_ + -6;
          pcVar7 = vm_val_t::get_as_string(this_00);
          if ((pcVar7 == (char *)0x0) &&
             ((this_00->typ != VM_OBJ ||
              ((iVar4 = CVmObjByteArray::is_byte_array(pvVar3[-6].val.obj), iVar4 == 0 &&
               (iVar4 = CVmObjLookupTable::is_lookup_table_obj(pvVar3[-6].val.obj), iVar4 == 0))))))
          {
            err_throw(0x900);
          }
        }
        if ((argc != 6) && (sp_[-7].typ != VM_NIL)) {
          pcVar7 = CVmBif::get_str_val(sp_ + -7);
          goto LAB_002031de;
        }
      }
      pcVar7 = (char *)0x0;
      goto LAB_002031de;
    }
  }
  this_00 = (vm_val_t *)0x0;
  pcVar5 = (char *)0x0;
  pcVar7 = (char *)0x0;
LAB_002031de:
  this = (HttpReqThread *)operator_new(0x90);
  HttpReqThread::HttpReqThread
            (this,pvVar2 + -1,(char *)local_90,local_98,options,pcVar5,this_00,pcVar7,&rc);
  iVar4 = OS_Thread::launch((OS_Thread *)this);
  if (iVar4 == 0) {
    HttpReqThread::post_result(this,-8,(CVmDataSource *)0x0,(char *)0x0,(char *)0x0);
  }
  CVmWeakRefable::release_ref((CVmWeakRefable *)this);
  sp_ = sp_ + -(long)(int)argc;
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifNet::send_net_request(VMG_ uint argc)
{
    /* check arguments - we need (id, url), and after that it varies */
    check_argc_range(vmg_ argc, 2, 32767);

    /* 
     *   set up a recursive VM context, in case we need it (we might, for
     *   evaluating FileUpload properties in a form body lookup table) 
     */
    vm_rcdesc rc(vmg_ "sendNetRequest", CVmBifNet::bif_table, 6, 
                 G_stk->get(0), argc);

    /* get the network safety levels */
    int client_level, server_level;
    G_host_ifc->get_net_safety(&client_level, &server_level);

    /* if the client safety level doesn't allow client operations, fail */
    if (client_level >= VM_NET_SAFETY_MAXIMUM)
        err_throw(VMERR_NETWORK_SAFETY);

    /* retrieve the ID value - any type is allowed here */
    vm_val_t *id = G_stk->get(0);

    /* retrieve the URL - this must be a string */
    const char *url = get_str_val(vmg_ G_stk->get(1));
    size_t urll = vmb_get_len(url);
    url += VMB_LEN;

    /* get the image URL, for logging purposes */
    const char *image_url = "<image URL unknown>";
    if (G_net_config != 0)
        image_url = G_net_config->get("image.url", "<image URL unknown>");

    /* map the URL to the local file character set */
    char *lurl;
    size_t lurll = G_cmap_to_file->map_utf8_alo(&lurl, url, urll);
    
    /* log the request */
    vm_log_fmt(vmg_ "client request to %.*s by %s",
               (int)lurll, lurl, image_url);

    /* done with the local version of the URL */
    t3free(lurl);

    /* check the protocol */
    if (urll >= 7
        && (memcmp(url, "http://", 7) == 0
            || memcmp(url, "https://", 8) == 0))
    {
        /* HTTP or HTTPS */

        /* 
         *   if we're restricted to local access, verify that the domain is
         *   "localhost" or "127.0.0.1"
         */
        if (client_level == VM_NET_SAFETY_LOCALHOST)
        {
            /* get a pointer to the domain */
            if (!match_url_domain(url, urll, "localhost")
                && !match_url_domain(url, urll, "127.0.0.1"))
                err_throw(VMERR_NETWORK_SAFETY);
        }

        /* get the verb - this must be a string */
        const char *verb = get_str_val(vmg_ G_stk->get(2));

        /* get the option flags, if present */
        int32_t options = 0;
        if (argc >= 4 && G_stk->get(3)->typ != VM_NIL)
            options = G_stk->get(3)->num_to_int(vmg0_);

        /* get the headers, if present */
        const char *hdrs = 0;
        if (argc >= 5 && G_stk->get(4)->typ != VM_NIL)
            hdrs = get_str_val(vmg_ G_stk->get(4));

        /* get the content body, if present */
        vm_val_t *body = 0;
        if (argc >= 6 && G_stk->get(5)->typ != VM_NIL)
        {
            /* get the body value */
            body = G_stk->get(5);

            /* 
             *   verify the body type - this must be a string, byte array, or
             *   lookup table 
             */
            if (body->get_as_string(vmg0_) != 0
                || (body->typ == VM_OBJ
                    && (CVmObjByteArray::is_byte_array(vmg_ body->val.obj)
                        || CVmObjLookupTable::is_lookup_table_obj(
                            vmg_ body->val.obj))))
            {
                /* acceptable body type */
            }
            else
            {
                /* invalid body type */
                err_throw(VMERR_BAD_TYPE_BIF);
            }
        }

        /* get the body's MIME type, if present */
        const char *body_type = 0;
        if (argc >= 7 && G_stk->get(6)->typ != VM_NIL)
            body_type = get_str_val(vmg_ G_stk->get(6));

        /* create the request processor thread */
        HttpReqThread *th = new HttpReqThread(
            vmg_ id, url - VMB_LEN, verb, options, hdrs, body, body_type, &rc);

        /* launch the thread */
        if (!th->launch())
        {
            /* 
             *   We couldn't launch the thread - post a result event
             *   indicating failure.  We have to post the result event
             *   ourselves because (a) a result event always has to be
             *   posted, even when the request fails, as it's the way that we
             *   transmit all status information back to the caller, and (b)
             *   the thread would normally post the result, but it won't be
             *   doing so because it never got started.
             */
            th->post_result(OS_HttpClient::ErrThread, 0, 0, 0);
        }

        /* done with the thread object */
        th->release_ref();
    }
    else
    {
        /* unknown protocol - it's an error */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* pop the arguments */
    G_stk->discard(argc);

    /* there's no return value, but return nil to clear out any old data */
    retval_nil(vmg0_);
}